

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O0

void png_do_read_filler(png_row_infop row_info,png_bytep row,png_uint_32 filler,png_uint_32 flags)

{
  uint uVar1;
  png_byte pVar2;
  png_byte pVar3;
  png_bytep local_b0;
  png_bytep dp_7;
  png_bytep sp_7;
  png_bytep dp_6;
  png_bytep sp_6;
  png_bytep dp_5;
  png_bytep sp_5;
  png_bytep dp_4;
  png_bytep sp_4;
  png_bytep dp_3;
  png_bytep sp_3;
  png_bytep dp_2;
  png_bytep sp_2;
  png_bytep dp_1;
  png_bytep sp_1;
  png_bytep dp;
  png_bytep sp;
  png_byte lo_filler;
  uint uStack_24;
  png_byte hi_filler;
  png_uint_32 row_width;
  png_uint_32 i;
  png_uint_32 flags_local;
  png_uint_32 filler_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  uVar1 = row_info->width;
  pVar2 = (png_byte)(filler >> 8);
  pVar3 = (png_byte)filler;
  if (row_info->color_type == '\0') {
    if (row_info->bit_depth == '\b') {
      if ((flags & 0x80) == 0) {
        sp_2 = row + uVar1 + uVar1;
        dp_1 = row + uVar1;
        for (uStack_24 = 0; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          sp_2[-1] = dp_1[-1];
          sp_2[-2] = pVar3;
          sp_2 = sp_2 + -2;
          dp_1 = dp_1 + -1;
        }
        row_info->channels = '\x02';
        row_info->pixel_depth = '\x10';
        row_info->rowbytes = (ulong)(uVar1 << 1);
      }
      else {
        sp_1 = row + uVar1 + uVar1;
        dp = row + uVar1;
        for (uStack_24 = 1; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          sp_1[-1] = pVar3;
          sp_1[-2] = dp[-1];
          sp_1 = sp_1 + -2;
          dp = dp + -1;
        }
        sp_1[-1] = pVar3;
        row_info->channels = '\x02';
        row_info->pixel_depth = '\x10';
        row_info->rowbytes = (ulong)(uVar1 << 1);
      }
    }
    else if (row_info->bit_depth == '\x10') {
      if ((flags & 0x80) == 0) {
        sp_4 = row + (ulong)uVar1 * 2 + (ulong)uVar1 * 2;
        dp_3 = row + (ulong)uVar1 * 2;
        for (uStack_24 = 0; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          sp_4[-1] = dp_3[-1];
          sp_4[-2] = dp_3[-2];
          sp_4[-3] = pVar3;
          sp_4[-4] = pVar2;
          sp_4 = sp_4 + -4;
          dp_3 = dp_3 + -2;
        }
        row_info->channels = '\x02';
        row_info->pixel_depth = ' ';
        row_info->rowbytes = (ulong)(uVar1 << 2);
      }
      else {
        sp_3 = row + (ulong)uVar1 * 2 + (ulong)uVar1 * 2;
        dp_2 = row + (ulong)uVar1 * 2;
        for (uStack_24 = 1; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          sp_3[-1] = pVar3;
          sp_3[-2] = pVar2;
          sp_3[-3] = dp_2[-1];
          sp_3[-4] = dp_2[-2];
          sp_3 = sp_3 + -4;
          dp_2 = dp_2 + -2;
        }
        sp_3[-1] = pVar3;
        sp_3[-2] = pVar2;
        row_info->channels = '\x02';
        row_info->pixel_depth = ' ';
        row_info->rowbytes = (ulong)(uVar1 << 2);
      }
    }
  }
  else if (row_info->color_type == '\x02') {
    if (row_info->bit_depth == '\b') {
      if ((flags & 0x80) == 0) {
        sp_6 = row + (ulong)uVar1 * 3 + uVar1;
        dp_5 = row + (ulong)uVar1 * 3;
        for (uStack_24 = 0; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          sp_6[-1] = dp_5[-1];
          sp_6[-2] = dp_5[-2];
          sp_6[-3] = dp_5[-3];
          sp_6[-4] = pVar3;
          sp_6 = sp_6 + -4;
          dp_5 = dp_5 + -3;
        }
        row_info->channels = '\x04';
        row_info->pixel_depth = ' ';
        row_info->rowbytes = (ulong)(uVar1 << 2);
      }
      else {
        sp_5 = row + (ulong)uVar1 * 3 + uVar1;
        dp_4 = row + (ulong)uVar1 * 3;
        for (uStack_24 = 1; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          sp_5[-1] = pVar3;
          sp_5[-2] = dp_4[-1];
          sp_5[-3] = dp_4[-2];
          sp_5[-4] = dp_4[-3];
          sp_5 = sp_5 + -4;
          dp_4 = dp_4 + -3;
        }
        sp_5[-1] = pVar3;
        row_info->channels = '\x04';
        row_info->pixel_depth = ' ';
        row_info->rowbytes = (ulong)(uVar1 << 2);
      }
    }
    else if (row_info->bit_depth == '\x10') {
      if ((flags & 0x80) == 0) {
        local_b0 = row + (ulong)uVar1 * 6 + (ulong)uVar1 * 2;
        dp_7 = row + (ulong)uVar1 * 6;
        for (uStack_24 = 0; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          local_b0[-1] = dp_7[-1];
          local_b0[-2] = dp_7[-2];
          local_b0[-3] = dp_7[-3];
          local_b0[-4] = dp_7[-4];
          local_b0[-5] = dp_7[-5];
          local_b0[-6] = dp_7[-6];
          local_b0[-7] = pVar3;
          local_b0[-8] = pVar2;
          local_b0 = local_b0 + -8;
          dp_7 = dp_7 + -6;
        }
        row_info->channels = '\x04';
        row_info->pixel_depth = '@';
        row_info->rowbytes = (ulong)(uVar1 << 3);
      }
      else {
        sp_7 = row + (ulong)uVar1 * 6 + (ulong)uVar1 * 2;
        dp_6 = row + (ulong)uVar1 * 6;
        for (uStack_24 = 1; uStack_24 < uVar1; uStack_24 = uStack_24 + 1) {
          sp_7[-1] = pVar3;
          sp_7[-2] = pVar2;
          sp_7[-3] = dp_6[-1];
          sp_7[-4] = dp_6[-2];
          sp_7[-5] = dp_6[-3];
          sp_7[-6] = dp_6[-4];
          sp_7[-7] = dp_6[-5];
          sp_7[-8] = dp_6[-6];
          sp_7 = sp_7 + -8;
          dp_6 = dp_6 + -6;
        }
        sp_7[-1] = pVar3;
        sp_7[-2] = pVar2;
        row_info->channels = '\x04';
        row_info->pixel_depth = '@';
        row_info->rowbytes = (ulong)(uVar1 << 3);
      }
    }
  }
  return;
}

Assistant:

static void
png_do_read_filler(png_row_infop row_info, png_bytep row,
    png_uint_32 filler, png_uint_32 flags)
{
   png_uint_32 i;
   png_uint_32 row_width = row_info->width;

#ifdef PNG_READ_16BIT_SUPPORTED
   png_byte hi_filler = (png_byte)(filler>>8);
#endif
   png_byte lo_filler = (png_byte)filler;

   png_debug(1, "in png_do_read_filler");

   if (
       row_info->color_type == PNG_COLOR_TYPE_GRAY)
   {
      if (row_info->bit_depth == 8)
      {
         if ((flags & PNG_FLAG_FILLER_AFTER) != 0)
         {
            /* This changes the data from G to GX */
            png_bytep sp = row + (size_t)row_width;
            png_bytep dp =  sp + (size_t)row_width;
            for (i = 1; i < row_width; i++)
            {
               *(--dp) = lo_filler;
               *(--dp) = *(--sp);
            }
            *(--dp) = lo_filler;
            row_info->channels = 2;
            row_info->pixel_depth = 16;
            row_info->rowbytes = row_width * 2;
         }

         else
         {
            /* This changes the data from G to XG */
            png_bytep sp = row + (size_t)row_width;
            png_bytep dp = sp  + (size_t)row_width;
            for (i = 0; i < row_width; i++)
            {
               *(--dp) = *(--sp);
               *(--dp) = lo_filler;
            }
            row_info->channels = 2;
            row_info->pixel_depth = 16;
            row_info->rowbytes = row_width * 2;
         }
      }

#ifdef PNG_READ_16BIT_SUPPORTED
      else if (row_info->bit_depth == 16)
      {
         if ((flags & PNG_FLAG_FILLER_AFTER) != 0)
         {
            /* This changes the data from GG to GGXX */
            png_bytep sp = row + (size_t)row_width * 2;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 1; i < row_width; i++)
            {
               *(--dp) = lo_filler;
               *(--dp) = hi_filler;
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
            }
            *(--dp) = lo_filler;
            *(--dp) = hi_filler;
            row_info->channels = 2;
            row_info->pixel_depth = 32;
            row_info->rowbytes = row_width * 4;
         }

         else
         {
            /* This changes the data from GG to XXGG */
            png_bytep sp = row + (size_t)row_width * 2;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = lo_filler;
               *(--dp) = hi_filler;
            }
            row_info->channels = 2;
            row_info->pixel_depth = 32;
            row_info->rowbytes = row_width * 4;
         }
      }
#endif
   } /* COLOR_TYPE == GRAY */
   else if (row_info->color_type == PNG_COLOR_TYPE_RGB)
   {
      if (row_info->bit_depth == 8)
      {
         if ((flags & PNG_FLAG_FILLER_AFTER) != 0)
         {
            /* This changes the data from RGB to RGBX */
            png_bytep sp = row + (size_t)row_width * 3;
            png_bytep dp = sp  + (size_t)row_width;
            for (i = 1; i < row_width; i++)
            {
               *(--dp) = lo_filler;
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
            }
            *(--dp) = lo_filler;
            row_info->channels = 4;
            row_info->pixel_depth = 32;
            row_info->rowbytes = row_width * 4;
         }

         else
         {
            /* This changes the data from RGB to XRGB */
            png_bytep sp = row + (size_t)row_width * 3;
            png_bytep dp = sp + (size_t)row_width;
            for (i = 0; i < row_width; i++)
            {
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = lo_filler;
            }
            row_info->channels = 4;
            row_info->pixel_depth = 32;
            row_info->rowbytes = row_width * 4;
         }
      }

#ifdef PNG_READ_16BIT_SUPPORTED
      else if (row_info->bit_depth == 16)
      {
         if ((flags & PNG_FLAG_FILLER_AFTER) != 0)
         {
            /* This changes the data from RRGGBB to RRGGBBXX */
            png_bytep sp = row + (size_t)row_width * 6;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 1; i < row_width; i++)
            {
               *(--dp) = lo_filler;
               *(--dp) = hi_filler;
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
            }
            *(--dp) = lo_filler;
            *(--dp) = hi_filler;
            row_info->channels = 4;
            row_info->pixel_depth = 64;
            row_info->rowbytes = row_width * 8;
         }

         else
         {
            /* This changes the data from RRGGBB to XXRRGGBB */
            png_bytep sp = row + (size_t)row_width * 6;
            png_bytep dp = sp  + (size_t)row_width * 2;
            for (i = 0; i < row_width; i++)
            {
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = *(--sp);
               *(--dp) = lo_filler;
               *(--dp) = hi_filler;
            }

            row_info->channels = 4;
            row_info->pixel_depth = 64;
            row_info->rowbytes = row_width * 8;
         }
      }
#endif
   } /* COLOR_TYPE == RGB */
}